

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O3

tuple<bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
__thiscall V4L2Device::decompress_jpeg(V4L2Device *this,v4l2_buffer *bufferinfo)

{
  bool bVar1;
  Options *this_00;
  Logger *pLVar2;
  _Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> _Var3;
  _Head_base<0UL,_unsigned_char_*,_false> _Var4;
  _Head_base<0UL,_V4L2Device::RawImage_*,_false> _Var5;
  uint uVar6;
  undefined1 uVar7;
  int iVar8;
  OptionDetails *this_01;
  bool *pbVar9;
  Writer *pWVar10;
  size_t sVar11;
  pointer __p;
  _Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> _Var12;
  uint *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar13;
  pointer *__ptr;
  tuple<bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  tVar14;
  uchar *buffer_array [1];
  jpeg_decompress_struct cinfo;
  JPEGErrorManager jerr;
  _Head_base<0UL,_V4L2Device::RawImage_*,_false> local_4b0;
  Writer local_4a8;
  undefined8 local_438 [17];
  uint local_3b0;
  uint local_3ac;
  int local_3a4;
  uint local_390;
  code *local_1a8 [2];
  code *local_198;
  undefined8 local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  __jmp_buf_tag local_f0;
  
  local_4b0._M_head_impl = (RawImage *)0x0;
  local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_100 = *(undefined8 *)&bufferinfo[5].field_12;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_f8,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(bufferinfo + 6));
  local_438[0] = jpeg_std_error(local_1a8);
  local_1a8[0] = jpeg_error_exit_cb;
  local_198 = jpeg_output_message_cb;
  iVar8 = _setjmp(&local_f0);
  if (iVar8 == 0) {
    jpeg_CreateDecompress(local_438,0x50,0x290);
    uVar13._0_4_ = (&bufferinfo->timecode)[(ulong)*in_RDX - 2].type;
    uVar13._4_4_ = (&bufferinfo->timecode)[(ulong)*in_RDX - 2].flags;
    jpeg_mem_src(local_438,uVar13,in_RDX[0x12]);
    iVar8 = jpeg_read_header(local_438,1);
    if (iVar8 == 1) {
      jpeg_start_decompress(local_438);
      uVar6 = local_3ac;
      __p = (pointer)operator_new(0x10);
      (__p->raw_data)._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
      __p->width = 0;
      __p->height = 0;
      std::__uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>::reset
                ((__uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
                  *)&local_4b0,__p);
      _Var12.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (_Head_base<0UL,_unsigned_char_*,_false>)
           operator_new__((ulong)(local_3a4 * local_3b0 * uVar6));
      _Var3.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           ((local_4b0._M_head_impl)->raw_data)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>;
      ((local_4b0._M_head_impl)->raw_data)._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false> =
           _Var12.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      if (_Var3.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0) {
        operator_delete__((void *)_Var3.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      }
      (local_4b0._M_head_impl)->width = local_3b0;
      (local_4b0._M_head_impl)->height = uVar6;
      if (local_390 < local_3ac) {
        do {
          local_4a8._vptr_Writer =
               (_func_int **)
               ((ulong)(local_390 * local_3a4 * local_3b0) +
               (long)((local_4b0._M_head_impl)->raw_data)._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>);
          jpeg_read_scanlines(local_438,&local_4a8,1);
        } while (local_390 < local_3ac);
      }
      jpeg_finish_decompress(local_438);
      jpeg_destroy_decompress(local_438);
      *(RawImage **)this = local_4b0._M_head_impl;
      uVar7 = 1;
      uVar13 = extraout_RDX_00;
      goto LAB_00143335;
    }
    local_4a8._vptr_Writer = (_func_int **)&PTR__Writer_00162088;
    local_4a8.m_level = Error;
    local_4a8.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_4a8.m_line = 0x20e;
    local_4a8.m_func =
         "std::tuple<bool, RawImagePtr> V4L2Device::decompress_jpeg(const struct v4l2_buffer &)";
    local_4a8.m_verboseLevel = 0;
    local_4a8.m_logger = (Logger *)0x0;
    local_4a8.m_proceed = false;
    local_4a8.m_messageBuilder.m_logger = (Logger *)0x0;
    local_4a8.m_messageBuilder.m_containerLogSeperator = "";
    local_4a8.m_dispatchAction = NormalLog;
    local_4a8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4a8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4a8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar10 = el::base::Writer::construct(&local_4a8,1,"default");
    if (pWVar10->m_proceed == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar10->m_messageBuilder).m_logger)->field_0x50,"broken JPEG",0xb);
      if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar10->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
    el::base::Writer::~Writer(&local_4a8);
    uVar13 = extraout_RDX_01;
  }
  else {
    this_00 = *(Options **)&bufferinfo[5].field_12;
    local_4a8._vptr_Writer = (_func_int **)&local_4a8.m_file;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"quiet","");
    this_01 = cxxopts::Options::operator[](this_00,(string *)&local_4a8);
    pbVar9 = cxxopts::OptionDetails::as<bool>(this_01);
    bVar1 = *pbVar9;
    if (local_4a8._vptr_Writer != (_func_int **)&local_4a8.m_file) {
      operator_delete(local_4a8._vptr_Writer);
    }
    if (bVar1 == false) {
      local_4a8._vptr_Writer = (_func_int **)&PTR__Writer_00162088;
      local_4a8.m_level = Warning;
      local_4a8.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
      ;
      local_4a8.m_line = 0x1ff;
      local_4a8.m_func =
           "std::tuple<bool, RawImagePtr> V4L2Device::decompress_jpeg(const struct v4l2_buffer &)";
      local_4a8.m_verboseLevel = 0;
      local_4a8.m_logger = (Logger *)0x0;
      local_4a8.m_proceed = false;
      local_4a8.m_messageBuilder.m_logger = (Logger *)0x0;
      local_4a8.m_messageBuilder.m_containerLogSeperator = "";
      local_4a8.m_dispatchAction = NormalLog;
      local_4a8.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_4a8.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_4a8.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pWVar10 = el::base::Writer::construct(&local_4a8,1,"default");
      if (pWVar10->m_proceed == true) {
        pLVar2 = (pWVar10->m_messageBuilder).m_logger;
        sVar11 = strlen(jpeg_last_error_msg);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pLVar2->field_0x50,jpeg_last_error_msg,sVar11);
        if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&((pWVar10->m_messageBuilder).m_logger)->field_0x50," ",1);
        }
      }
      el::base::Writer::~Writer(&local_4a8);
    }
    jpeg_destroy_decompress(local_438);
    uVar13 = extraout_RDX;
  }
  *(RawImage **)this = local_4b0._M_head_impl;
  uVar7 = 0;
LAB_00143335:
  local_4b0._M_head_impl = (RawImage *)0x0;
  *(undefined1 *)&(this->buffers)._M_elems[0].start = uVar7;
  if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
    _Var5._M_head_impl = local_4b0._M_head_impl;
    uVar13 = extraout_RDX_02;
    if (local_4b0._M_head_impl != (RawImage *)0x0) {
      _Var4._M_head_impl =
           ((local_4b0._M_head_impl)->raw_data)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      if (_Var4._M_head_impl != (uchar *)0x0) {
        operator_delete__(_Var4._M_head_impl);
      }
      operator_delete(_Var5._M_head_impl);
      uVar13 = extraout_RDX_03;
    }
  }
  tVar14.
  super__Tuple_impl<0UL,_bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  ._8_8_ = uVar13;
  tVar14.
  super__Tuple_impl<0UL,_bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  .
  super__Tuple_impl<1UL,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  .
  super__Head_base<1UL,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>,_false>
  ._M_head_impl._M_t.
  super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>._M_t.
  super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>.
  super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl =
       (_Head_base<1UL,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>,_false>
        )(_Head_base<1UL,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>,_false>
          )this;
  return (tuple<bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
          )tVar14.
           super__Tuple_impl<0UL,_bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  ;
}

Assistant:

std::tuple<bool, RawImagePtr>
    decompress_jpeg(const struct v4l2_buffer& bufferinfo)
    {
        struct jpeg_decompress_struct cinfo;
        RawImagePtr image;

        JPEGErrorManager jerr;
        jerr.options = options;
        cinfo.err = jpeg_std_error(&jerr.pub);
        jerr.pub.error_exit = jpeg_error_exit_cb;
        jerr.pub.output_message = jpeg_output_message_cb;

        if (setjmp(jerr.setjmp_buffer)) {
            // If we get here, the JPEG code has signaled an error.
            auto quiet = (*options)["quiet"].as<bool>();
            if (not quiet) {
                LOG(WARNING) << jpeg_last_error_msg;
            }

            jpeg_destroy_decompress(&cinfo);

            return std::make_tuple(false, std::move(image));
        }

        jpeg_create_decompress(&cinfo);

        auto idx = bufferinfo.index;
        jpeg_mem_src(&cinfo, static_cast<unsigned char*>(buffers[idx].start), bufferinfo.length);

        auto rc = jpeg_read_header(&cinfo, TRUE);
        if (rc != 1) {
            LOG(ERROR) << "broken JPEG";
            return std::make_tuple(false, std::move(image));
        }

        jpeg_start_decompress(&cinfo);

        auto width = cinfo.output_width;
        auto height = cinfo.output_height;
        auto pixel_size = cinfo.output_components;
        auto row_stride = width * pixel_size;
        auto raw_size = width * height * pixel_size;

        image = RawImagePtr(new RawImage);

        image->raw_data = MemBufferPtr(new unsigned char[raw_size]);
        image->width = width;
        image->height = height;

        while (cinfo.output_scanline < cinfo.output_height) {
            unsigned char* buffer_array[1];
            buffer_array[0] = image->raw_data.get() + (cinfo.output_scanline) * row_stride;
            jpeg_read_scanlines(&cinfo, buffer_array, 1);
        }

        jpeg_finish_decompress(&cinfo);
        jpeg_destroy_decompress(&cinfo);

        return std::make_tuple(true, std::move(image));
    }